

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O1

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  void *pvVar1;
  mbedtls_ecp_keypair *ec;
  bool bVar2;
  mbedtls_pk_type_t mVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  uchar *c;
  uchar *local_30;
  
  local_30 = buf + size;
  mVar3 = mbedtls_pk_get_type(key);
  if (mVar3 == MBEDTLS_PK_RSA) {
    pvVar1 = key->pk_ctx;
    uVar4 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0xb8));
    if ((int)uVar4 < 0) {
      uVar6 = 0;
    }
    else {
      uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0xa0));
      if ((int)uVar5 < 0) {
        bVar2 = false;
        goto joined_r0x0012995b;
      }
      uVar6 = uVar5 + uVar4;
      uVar4 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0x88));
      if (-1 < (int)uVar4) {
        sVar7 = (ulong)uVar4 + (ulong)uVar6;
        uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0x70));
        if (-1 < (int)uVar5) {
          sVar7 = sVar7 + uVar5;
          uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0x58));
          if (-1 < (int)uVar5) {
            sVar7 = sVar7 + uVar5;
            uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0x40));
            if (-1 < (int)uVar5) {
              sVar7 = sVar7 + uVar5;
              uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0x28));
              if (-1 < (int)uVar5) {
                sVar7 = sVar7 + uVar5;
                uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,(mbedtls_mpi *)((long)pvVar1 + 0x10));
                if (-1 < (int)uVar5) {
                  sVar7 = sVar7 + uVar5;
                  uVar5 = mbedtls_asn1_write_int(&local_30,buf,0);
                  if (-1 < (int)uVar5) {
                    sVar7 = sVar7 + uVar5;
                    uVar5 = mbedtls_asn1_write_len(&local_30,buf,sVar7);
                    if (-1 < (int)uVar5) {
                      sVar7 = sVar7 + uVar5;
                      uVar5 = mbedtls_asn1_write_tag(&local_30,buf,'0');
                      if (-1 < (int)uVar5) {
                        bVar2 = true;
                        uVar4 = (int)sVar7 + uVar5;
                        goto joined_r0x0012995b;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar2 = false;
        uVar4 = (uint)sVar7;
        goto joined_r0x0012995b;
      }
    }
    bVar2 = false;
    uVar5 = uVar4;
    uVar4 = uVar6;
    goto joined_r0x0012995b;
  }
  mVar3 = mbedtls_pk_get_type(key);
  if (mVar3 != MBEDTLS_PK_ECKEY) {
    return -0x3980;
  }
  ec = (mbedtls_ecp_keypair *)key->pk_ctx;
  uVar5 = pk_write_ec_pubkey(&local_30,buf,ec);
  if ((int)uVar5 < 0) {
LAB_00129955:
    sVar7 = 0;
LAB_00129957:
    bVar2 = false;
  }
  else {
    if ((long)local_30 - (long)buf < 1) {
      uVar5 = 0xffffff94;
      goto LAB_00129955;
    }
    local_30[-1] = '\0';
    uVar4 = uVar5 + 1;
    local_30 = local_30 + -1;
    uVar5 = mbedtls_asn1_write_len(&local_30,buf,(ulong)uVar4);
    if ((int)uVar5 < 0) goto LAB_00129955;
    uVar6 = mbedtls_asn1_write_tag(&local_30,buf,'\x03');
    if (-1 < (int)uVar6) {
      sVar7 = (ulong)uVar4 + (ulong)uVar6 + (ulong)uVar5;
      uVar5 = mbedtls_asn1_write_len(&local_30,buf,sVar7);
      if ((int)uVar5 < 0) goto LAB_00129955;
      uVar6 = mbedtls_asn1_write_tag(&local_30,buf,0xa1);
      if ((int)uVar6 < 0) goto LAB_0012995f;
      sVar7 = sVar7 + uVar6 + (ulong)uVar5;
      uVar4 = pk_write_ec_param(&local_30,buf,ec);
      uVar5 = uVar4;
      if (-1 < (int)uVar4) {
        uVar5 = mbedtls_asn1_write_len(&local_30,buf,(ulong)uVar4);
        if (-1 < (int)uVar5) {
          uVar6 = mbedtls_asn1_write_tag(&local_30,buf,0xa0);
          if (-1 < (int)uVar6) {
            sVar7 = sVar7 + (ulong)uVar6 + (ulong)(uVar5 + uVar4);
            uVar5 = mbedtls_asn1_write_mpi(&local_30,buf,&ec->d);
            if (-1 < (int)uVar5) {
              sVar7 = sVar7 + uVar5;
              *local_30 = '\x04';
              uVar5 = mbedtls_asn1_write_int(&local_30,buf,1);
              if (-1 < (int)uVar5) {
                sVar7 = sVar7 + uVar5;
                uVar5 = mbedtls_asn1_write_len(&local_30,buf,sVar7);
                if (-1 < (int)uVar5) {
                  sVar7 = sVar7 + uVar5;
                  uVar5 = mbedtls_asn1_write_tag(&local_30,buf,'0');
                  if (-1 < (int)uVar5) {
                    sVar7 = sVar7 + uVar5;
                    bVar2 = true;
                    goto LAB_00129959;
                  }
                }
              }
            }
            goto LAB_00129957;
          }
          goto LAB_00129961;
        }
        bVar2 = false;
        goto LAB_00129959;
      }
      goto LAB_00129957;
    }
LAB_0012995f:
    sVar7 = 0;
LAB_00129961:
    uVar5 = uVar6;
    bVar2 = false;
  }
LAB_00129959:
  uVar4 = (uint)sVar7;
joined_r0x0012995b:
  if (bVar2) {
    uVar5 = uVar4;
  }
  return uVar5;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c = buf + size;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->QP ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->DQ ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->DP ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->Q ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->P ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->D ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->E ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->N ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey: write as MPI then fix tag */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &ec->d ) );
        *c = MBEDTLS_ASN1_OCTET_STRING;

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}